

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

size_t FourCCToString(tchar_t *Out,size_t OutLen,fourcc_t FourCC)

{
  bool bVar1;
  fourcc_t local_2c;
  size_t sStack_28;
  anon_union_4_2_94730004 s;
  size_t i;
  size_t sStack_18;
  fourcc_t FourCC_local;
  size_t OutLen_local;
  tchar_t *Out_local;
  
  OutLen_local = (size_t)Out;
  sStack_18 = OutLen;
  i._4_4_ = FourCC;
  sStack_28 = 0;
  if (OutLen != 0) {
    local_2c = FourCC;
    for (sStack_28 = 0; sStack_28 < 4 && sStack_28 < OutLen - 1; sStack_28 = sStack_28 + 1) {
      Out[sStack_28] = *(tchar_t *)((long)&local_2c + sStack_28);
    }
    while( true ) {
      bVar1 = false;
      if (sStack_28 != 0) {
        bVar1 = Out[sStack_28 - 1] == '_';
      }
      if (!bVar1) break;
      sStack_28 = sStack_28 - 1;
    }
    Out[sStack_28] = '\0';
  }
  return sStack_28;
}

Assistant:

size_t FourCCToString(tchar_t* Out, size_t OutLen, fourcc_t FourCC)
{
    size_t i=0;
    if (OutLen)
    {
	    union
	    {
		    fourcc_t d;
		    uint8_t a[4];
	    } s;

	    s.d = FourCC;
	    for (i=0;i<4 && i<OutLen-1;++i)
            Out[i] = s.a[i];

        while (i>0 && Out[i-1]=='_')
            --i;

        Out[i] = 0;
    }
    return i;
}